

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_vli lzma_index_file_size(lzma_index *i)

{
  index_tree_node *piVar1;
  index_tree_node *piVar2;
  lzma_vli lVar3;
  index_tree_node *local_30;
  index_group *g;
  index_stream *s;
  lzma_index *i_local;
  
  piVar1 = (i->streams).rightmost;
  piVar2 = piVar1[1].right;
  if (piVar2 == (index_tree_node *)0x0) {
    local_30 = (index_tree_node *)0x0;
  }
  else {
    local_30 = (&piVar2[1].right)[(long)piVar2[1].parent * 2];
  }
  lVar3 = index_file_size(piVar1->compressed_base,(lzma_vli)local_30,piVar1[2].compressed_base,
                          (lzma_vli)piVar1[2].parent,piVar1[4].uncompressed_base);
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_index_file_size(const lzma_index *i)
{
	const index_stream *s = (const index_stream *)(i->streams.rightmost);
	const index_group *g = (const index_group *)(s->groups.rightmost);
	return index_file_size(s->node.compressed_base,
			g == NULL ? 0 : g->records[g->last].unpadded_sum,
			s->record_count, s->index_list_size,
			s->stream_padding);
}